

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

float deqp::gles3::Performance::anon_unknown_1::getAreaBetweenLines
                (float xmin,float xmax,float lineAOffset,float lineACoefficient,float lineBOffset,
                float lineBCoefficient)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar3 = lineACoefficient * xmin + lineAOffset;
  fVar4 = lineACoefficient * xmax + lineAOffset;
  fVar5 = lineBCoefficient * xmin + lineBOffset;
  fVar6 = lineBCoefficient * xmax + lineBOffset;
  if (fVar5 < fVar3 != fVar4 <= fVar6) {
    fVar3 = (xmin + xmax) * 0.5;
    fVar4 = (lineACoefficient * fVar3 + lineAOffset) - (lineBCoefficient * fVar3 + lineBOffset);
    fVar3 = -fVar4;
    if (-fVar4 <= fVar4) {
      fVar3 = fVar4;
    }
    return fVar3 * (xmax - xmin);
  }
  fVar2 = lineACoefficient - lineBCoefficient;
  fVar1 = -fVar2;
  if (-fVar2 <= fVar2) {
    fVar1 = fVar2;
  }
  fVar2 = 0.0;
  if (0.0001 <= fVar1) {
    fVar4 = fVar4 - fVar6;
    fVar6 = -fVar4;
    if (-fVar4 <= fVar4) {
      fVar6 = fVar4;
    }
    fVar3 = fVar3 - fVar5;
    fVar4 = -fVar3;
    if (-fVar3 <= fVar3) {
      fVar4 = fVar3;
    }
    fVar2 = (fVar6 / fVar1) * fVar6 * 0.5 + (fVar4 / fVar1) * fVar4 * 0.5;
  }
  return fVar2;
}

Assistant:

static float getAreaBetweenLines (float xmin, float xmax, float lineAOffset, float lineACoefficient, float lineBOffset, float lineBCoefficient)
{
	const float lineAMin		= lineAOffset + lineACoefficient * xmin;
	const float lineAMax		= lineAOffset + lineACoefficient * xmax;
	const float lineBMin		= lineBOffset + lineBCoefficient * xmin;
	const float lineBMax		= lineBOffset + lineBCoefficient * xmax;
	const bool	aOverBAtBegin	= (lineAMin > lineBMin);
	const bool	aOverBAtEnd		= (lineAMax > lineBMax);

	if (aOverBAtBegin == aOverBAtEnd)
	{
		// lines do not intersect

		const float midpoint	= (xmin + xmax) / 2.0f;
		const float width		= (xmax - xmin);

		const float lineAHeight	= lineAOffset + lineACoefficient * midpoint;
		const float lineBHeight	= lineBOffset + lineBCoefficient * midpoint;

		return width * de::abs(lineAHeight - lineBHeight);
	}
	else
	{

		// lines intersect

		const float approachCoeffient	= de::abs(lineACoefficient - lineBCoefficient);
		const float epsilon				= 0.0001f;
		const float leftHeight			= de::abs(lineAMin - lineBMin);
		const float rightHeight			= de::abs(lineAMax - lineBMax);

		if (approachCoeffient < epsilon)
			return 0.0f;

		return (0.5f * leftHeight * (leftHeight / approachCoeffient)) + (0.5f * rightHeight * (rightHeight / approachCoeffient));
	}
}